

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O0

void __thiscall
embree::CoronaLoader::CoronaLoader(CoronaLoader *this,FileName *fileName,AffineSpace3fa *space)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  bool bVar10;
  uint uVar11;
  long *plVar12;
  size_type sVar13;
  runtime_error *this_00;
  undefined8 *in_RDX;
  AffineSpace3fa *in_RDI;
  size_t i;
  Ref<embree::SceneGraph::GroupNode> group;
  Ref<embree::XML> xml;
  FileName *in_stack_fffffffffffffab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac0;
  GroupNode *in_stack_fffffffffffffac8;
  size_t in_stack_fffffffffffffad8;
  Vector *pVVar14;
  GroupNode *in_stack_fffffffffffffae0;
  bool local_516;
  bool local_512;
  FileName *in_stack_fffffffffffffb08;
  undefined8 in_stack_fffffffffffffb28;
  undefined1 hasHeader;
  string *in_stack_fffffffffffffb30;
  FileName *in_stack_fffffffffffffb38;
  ParseLocation *in_stack_fffffffffffffb68;
  allocator *xml_00;
  CoronaLoader *this_01;
  AffineSpace3fa *child;
  TransformNode *this_02;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined1 local_3e1;
  string local_3c0 [32];
  long *local_3a0;
  long *local_398;
  ulong local_390;
  long *local_388;
  allocator local_379;
  string local_378 [32];
  long *local_358 [7];
  undefined8 *local_320;
  long **local_308;
  long **local_2f8;
  long **local_2f0;
  long **local_2e8;
  long **local_2e0;
  long *local_2d8;
  long **local_2d0;
  long **local_2c8;
  long **local_2c0;
  long **local_2b0;
  long **local_298;
  long **local_290;
  long *local_288;
  long **local_280;
  long **local_278;
  Vector *local_268;
  long **local_260;
  Vector *local_258;
  undefined8 *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  long *local_238;
  Vector *local_230;
  undefined8 *local_228;
  undefined4 local_21c;
  undefined4 local_218;
  undefined4 local_214;
  undefined8 *local_210;
  undefined4 local_204;
  undefined4 local_200;
  undefined4 local_1fc;
  undefined8 *local_1f8;
  undefined4 local_1ec;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined4 local_1c0;
  undefined4 local_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  undefined4 local_17c;
  undefined8 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  undefined8 *local_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  hasHeader = (undefined1)((ulong)in_stack_fffffffffffffb28 >> 0x38);
  local_320 = in_RDX;
  embree::FileName::FileName((FileName *)0x414ea4);
  this_01 = (CoronaLoader *)&(in_RDI->l).vz;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
         *)0x414ebd);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
         *)0x414ed6);
  child = in_RDI + 2;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
         *)0x414ef2);
  this_02 = (TransformNode *)&in_RDI[2].p;
  *(undefined8 *)&((Vector *)this_02)->field_0 = 0;
  local_268 = (Vector *)this_02;
  embree::FileName::path(in_stack_fffffffffffffb08);
  embree::FileName::operator=((FileName *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  embree::FileName::~FileName((FileName *)0x414f60);
  xml_00 = &local_379;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,"/.-",xml_00);
  parseXML(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,(bool)hasHeader);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  local_2e0 = local_358;
  bVar10 = std::operator==(in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8);
  if (bVar10) {
    plVar12 = (long *)::operator_new(0x80);
    SceneGraph::GroupNode::GroupNode(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    local_2d0 = &local_388;
    local_2d8 = plVar12;
    local_388 = plVar12;
    if (plVar12 != (long *)0x0) {
      (**(code **)(*plVar12 + 0x10))();
    }
    local_390 = 0;
    while( true ) {
      uVar9 = local_390;
      local_2e8 = local_358;
      sVar13 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::
               size((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
                    (local_358[0] + 0x10));
      if (sVar13 <= uVar9) break;
      local_2c8 = &local_388;
      local_2f0 = local_358;
      std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
                ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
                 (local_358[0] + 0x10),local_390);
      loadNode(this_01,(Ref<embree::XML> *)xml_00);
      SceneGraph::GroupNode::add
                (in_stack_fffffffffffffac8,
                 (Ref<embree::SceneGraph::Node> *)in_stack_fffffffffffffac0);
      local_2c0 = &local_398;
      if (local_398 != (long *)0x0) {
        (**(code **)(*local_398 + 0x18))();
      }
      local_390 = local_390 + 1;
    }
    local_290 = &local_3a0;
    local_298 = &local_388;
    local_288 = local_388;
    local_280 = &local_3a0;
    local_3a0 = local_388;
    if (local_388 != (long *)0x0) {
      (**(code **)(*local_388 + 0x10))();
    }
    pVVar14 = &in_RDI[2].p;
    local_260 = &local_3a0;
    local_258 = pVVar14;
    if (*(long *)&pVVar14->field_0 != 0) {
      (**(code **)(**(long **)&pVVar14->field_0 + 0x18))();
    }
    *(long **)&pVVar14->field_0 = *local_260;
    *local_260 = (long *)0x0;
    local_2b0 = &local_3a0;
    if (local_3a0 != (long *)0x0) {
      (**(code **)(*local_3a0 + 0x18))();
    }
    local_278 = &local_388;
    if (local_388 != (long *)0x0) {
      (**(code **)(*local_388 + 0x18))();
    }
    local_240 = &local_428;
    local_160 = &one;
    local_130 = &embree::zero;
    local_138 = &embree::zero;
    local_214 = 0x3f800000;
    local_218 = 0;
    local_21c = 0;
    local_17c = 0;
    local_180 = 0;
    local_184 = 0;
    local_188 = 0x3f800000;
    local_198 = 0x3f800000;
    uStack_190 = 0;
    local_428 = 0x3f800000;
    uStack_420 = 0;
    local_1f8 = &local_418;
    local_140 = &embree::zero;
    local_168 = &one;
    local_148 = &embree::zero;
    local_1fc = 0;
    local_200 = 0x3f800000;
    local_204 = 0;
    local_19c = 0;
    local_1a0 = 0;
    local_1a4 = 0x3f800000;
    local_1a8 = 0;
    local_1b8 = 0x3f80000000000000;
    uStack_1b0 = 0;
    local_418 = 0x3f80000000000000;
    uStack_410 = 0;
    local_1e0 = &local_408;
    local_150 = &embree::zero;
    local_158 = &embree::zero;
    local_170 = &one;
    local_1e4 = 0;
    local_1e8 = 0;
    local_1ec = 0x3f800000;
    local_1bc = 0;
    local_1c0 = 0x3f800000;
    local_1c4 = 0;
    local_1c8 = 0;
    local_1d8 = 0;
    uStack_1d0 = 0x3f800000;
    local_408 = 0;
    uStack_400 = 0x3f800000;
    local_178 = &local_3f8;
    local_128 = 0;
    uStack_120 = 0;
    local_3f8 = 0;
    uStack_3f0 = 0;
    local_248 = local_320;
    local_250 = &local_428;
    local_110 = local_320;
    local_e0 = local_320;
    uVar1 = *local_320;
    uVar2 = local_320[1];
    local_68 = 0x3f800000;
    uStack_60 = 0;
    local_58._0_4_ = (float)uVar1;
    local_58._4_4_ = (float)((ulong)uVar1 >> 0x20);
    uStack_50._0_4_ = (float)uVar2;
    uStack_50._4_4_ = (float)((ulong)uVar2 >> 0x20);
    local_b8 = -(uint)((float)local_58 == 1.0);
    iStack_b4 = -(uint)(local_58._4_4_ == 0.0);
    iStack_b0 = -(uint)((float)uStack_50 == 0.0);
    iStack_ac = -(uint)(uStack_50._4_4_ == 0.0);
    auVar6._4_4_ = iStack_b4;
    auVar6._0_4_ = local_b8;
    auVar6._8_4_ = iStack_b0;
    auVar6._12_4_ = iStack_ac;
    uVar11 = movmskps((int)local_250,auVar6);
    local_512 = false;
    if ((uVar11 & 7) == 7) {
      local_f0 = local_320 + 2;
      local_f8 = &local_418;
      uVar3 = *local_f0;
      uVar4 = local_320[3];
      local_48 = 0x3f80000000000000;
      uStack_40 = 0;
      local_38._0_4_ = (float)uVar3;
      local_38._4_4_ = (float)((ulong)uVar3 >> 0x20);
      uStack_30._0_4_ = (float)uVar4;
      uStack_30._4_4_ = (float)((ulong)uVar4 >> 0x20);
      local_a8 = -(uint)((float)local_38 == 0.0);
      iStack_a4 = -(uint)(local_38._4_4_ == 1.0);
      iStack_a0 = -(uint)((float)uStack_30 == 0.0);
      iStack_9c = -(uint)(uStack_30._4_4_ == 0.0);
      auVar7._4_4_ = iStack_a4;
      auVar7._0_4_ = local_a8;
      auVar7._8_4_ = iStack_a0;
      auVar7._12_4_ = iStack_9c;
      uVar11 = movmskps((int)local_f8,auVar7);
      local_512 = false;
      local_38 = uVar3;
      uStack_30 = uVar4;
      if ((uVar11 & 7) == 7) {
        local_100 = local_320 + 4;
        local_108 = &local_408;
        uVar3 = *local_100;
        uVar4 = local_320[5];
        local_28 = 0;
        uStack_20 = 0x3f800000;
        local_18._0_4_ = (float)uVar3;
        local_18._4_4_ = (float)((ulong)uVar3 >> 0x20);
        uStack_10._0_4_ = (float)uVar4;
        uStack_10._4_4_ = (float)((ulong)uVar4 >> 0x20);
        local_98 = -(uint)((float)local_18 == 0.0);
        iStack_94 = -(uint)(local_18._4_4_ == 0.0);
        iStack_90 = -(uint)((float)uStack_10 == 1.0);
        iStack_8c = -(uint)(uStack_10._4_4_ == 0.0);
        auVar8._4_4_ = iStack_94;
        auVar8._0_4_ = local_98;
        auVar8._8_4_ = iStack_90;
        auVar8._12_4_ = iStack_8c;
        uVar11 = movmskps((int)local_108,auVar8);
        local_512 = (uVar11 & 7) == 7;
        local_18 = uVar3;
        uStack_10 = uVar4;
      }
    }
    local_516 = false;
    if (local_512) {
      local_d0 = local_320 + 6;
      local_d8 = &local_3f8;
      uVar3 = *local_d0;
      uVar4 = local_320[7];
      local_88 = 0;
      uStack_80 = 0;
      local_78._0_4_ = (float)uVar3;
      local_78._4_4_ = (float)((ulong)uVar3 >> 0x20);
      uStack_70._0_4_ = (float)uVar4;
      uStack_70._4_4_ = (float)((ulong)uVar4 >> 0x20);
      local_c8 = -(uint)((float)local_78 == 0.0);
      iStack_c4 = -(uint)(local_78._4_4_ == 0.0);
      iStack_c0 = -(uint)((float)uStack_70 == 0.0);
      iStack_bc = -(uint)(uStack_70._4_4_ == 0.0);
      auVar5._4_4_ = iStack_c4;
      auVar5._0_4_ = local_c8;
      auVar5._8_4_ = iStack_c0;
      auVar5._12_4_ = iStack_bc;
      uVar11 = movmskps((int)local_d8,auVar5);
      local_516 = (uVar11 & 7) == 7;
      local_78 = uVar3;
      uStack_70 = uVar4;
    }
    local_228 = local_240;
    local_210 = local_240;
    local_118 = local_250;
    local_e8 = local_250;
    local_58 = uVar1;
    uStack_50 = uVar2;
    if (!local_516) {
      plVar12 = (long *)SceneGraph::TransformNode::operator_new(0x415bf6);
      SceneGraph::TransformNode::TransformNode
                (this_02,in_RDI,(Ref<embree::SceneGraph::Node> *)child);
      pVVar14 = &in_RDI[2].p;
      local_238 = plVar12;
      local_230 = pVVar14;
      if (plVar12 != (long *)0x0) {
        (**(code **)(*plVar12 + 0x10))();
      }
      if (*(long *)&pVVar14->field_0 != 0) {
        (**(code **)(**(long **)&pVVar14->field_0 + 0x18))();
      }
      *(long **)&pVVar14->field_0 = local_238;
    }
    local_308 = local_358;
    if (local_358[0] != (long *)0x0) {
      (**(code **)(*local_358[0] + 0x18))();
    }
    return;
  }
  local_3e1 = 1;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_2f8 = local_358;
  ParseLocation::str_abi_cxx11_(in_stack_fffffffffffffb68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffac8,(char *)in_stack_fffffffffffffac0);
  std::runtime_error::runtime_error(this_00,local_3c0);
  local_3e1 = 0;
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CoronaLoader::CoronaLoader(const FileName& fileName, const AffineSpace3fa& space)
  {
    path = fileName.path();
    Ref<XML> xml = parseXML(fileName,"/.-",false);
    if (xml->name == "scene") 
    {
      Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;
      for (size_t i=0; i<xml->children.size(); i++) { 
        group->add(loadNode(xml->children[i]));
      }
      root = group.cast<SceneGraph::Node>();
    }
    else 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid scene tag");

    if (space == AffineSpace3fa(one)) 
      return;
    
    root = new SceneGraph::TransformNode(space,root);
  }